

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O1

void __thiscall
wasm::EffectAnalyzer::InternalAnalyzer::visitArrayGet(InternalAnalyzer *this,ArrayGet *curr)

{
  EffectAnalyzer *pEVar1;
  char cVar2;
  
  cVar2 = ::wasm::Type::isRef();
  if (cVar2 != '\0') {
    ::wasm::Type::getHeapType();
    cVar2 = ::wasm::HeapType::isBottom();
    if (cVar2 != '\0') {
      this->parent->trap = true;
      return;
    }
  }
  pEVar1 = this->parent;
  pEVar1->readsArray = true;
  pEVar1->implicitTrap = true;
  return;
}

Assistant:

void visitArrayGet(ArrayGet* curr) {
      if (curr->ref->type.isNull()) {
        parent.trap = true;
        return;
      }
      parent.readsArray = true;
      // traps when the arg is null or the index out of bounds
      parent.implicitTrap = true;
    }